

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

void runtime(void)

{
  ostream *poVar1;
  ofstream ppm;
  long local_aac8;
  filebuf local_aac0 [240];
  ios_base local_a9d0 [264];
  OutputImage<cert::Color,_120UL,_120UL> local_a8c8;
  
  std::ofstream::ofstream(&local_aac8,"output_runtime.ppm",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_aac8,"P3\n",3);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_aac8,0x78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n255\n",5);
  cert::raytrace<120ul,120ul,120ul,120ul,0ul,0ul,3ul>();
  print_image<cert::OutputImage<cert::Color,120ul,120ul>>((ofstream *)&local_aac8,&local_a8c8);
  local_aac8 = _VTT;
  *(undefined8 *)(local_aac0 + *(long *)(_VTT + -0x18) + -8) = ___cxa_atexit;
  std::filebuf::~filebuf(local_aac0);
  std::ios_base::~ios_base(local_a9d0);
  return;
}

Assistant:

void runtime ()
{
	std::ofstream ppm ("output_runtime.ppm");
	ppm << "P3\n" << width << " " << height << "\n255\n";
	print_image (ppm, cert::raytrace<width, height, width, height, 0, 0, samples> ());
}